

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O0

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  initializer_list<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  __l;
  FILE *__stream;
  const_iterator cVar1;
  bool bVar2;
  Opcode OVar3;
  int iVar4;
  Expr *expr;
  undefined8 uVar5;
  pointer pvVar6;
  Value *pVVar7;
  long *plVar8;
  undefined4 in_register_00000034;
  hasher *in_R8;
  string_view format_str;
  code *local_1d0;
  allocator<char> local_191;
  string local_190 [32];
  char *local_170;
  basic_string_view<char> local_168;
  string local_158;
  _Node_iterator_base<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
  local_138;
  uint local_12c;
  _Node_iterator_base<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
  local_128;
  const_iterator i;
  Value *rhs;
  allocator<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  local_103;
  key_equal local_102;
  hasher local_101;
  pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_100 [9];
  iterator local_28;
  size_type local_20;
  UnaryExpr *local_18;
  UnaryExpr *expr_local;
  IRGenerator *this_local;
  
  local_18 = (UnaryExpr *)CONCAT44(in_register_00000034,__fd);
  expr_local = (UnaryExpr *)this;
  if ((accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_), iVar4 != 0)) {
    memcpy(local_100,&DAT_002c8df0,0xd8);
    local_20 = 9;
    local_28 = local_100;
    std::
    allocator<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    ::allocator(&local_103);
    __l._M_len = local_20;
    __l._M_array = local_28;
    in_R8 = &local_101;
    std::
    unordered_map<int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
    ::unordered_map(&accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_,__l,0,in_R8,&local_102,
                    &local_103);
    std::
    allocator<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
    ::~allocator(&local_103);
    __cxa_atexit(std::
                 unordered_map<int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
                 ::~unordered_map,&accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_);
  }
  expr = UnaryExpr::subExpr(local_18);
  i.
  super__Node_iterator_base<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
             )codegen(this,expr);
  OVar3 = UnaryExpr::op(local_18);
  local_12c = (uint)OVar3;
  local_128._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
       ::find(&accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_,(key_type *)&local_12c);
  local_138._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
       ::end(&accept(flow::lang::UnaryExpr&)::ops_abi_cxx11_);
  bVar2 = std::__detail::operator!=(&local_128,&local_138);
  __stream = _stderr;
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    fmt::v5::basic_string_view<char>::basic_string_view
              (&local_168,"Unsupported unary expression {} in IRGenerator.");
    OVar3 = UnaryExpr::op(local_18);
    local_170 = mnemonic(OVar3);
    format_str.size_ = (size_t)&local_170;
    format_str.data_ = (char *)local_168.size_;
    fmt::v5::format<char_const*>(&local_158,(v5 *)local_168.data_,format_str,(char **)in_R8);
    uVar5 = std::__cxx11::string::c_str();
    fprintf(__stream,"%s\n",uVar5);
    std::__cxx11::string::~string((string *)&local_158);
    abort();
  }
  pvVar6 = std::__detail::
           _Node_const_iterator<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false,_false>
           ::operator->((_Node_const_iterator<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false,_false>
                         *)&local_128);
  cVar1 = i;
  local_1d0 = (code *)pvVar6->second;
  plVar8 = (long *)((long)&(this->super_ASTVisitor)._vptr_ASTVisitor + *(long *)&pvVar6->field_0x10)
  ;
  if (((ulong)local_1d0 & 1) != 0) {
    local_1d0 = *(code **)(local_1d0 + *plVar8 + -1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_190,"",&local_191);
  pVVar7 = (Value *)(*local_1d0)(plVar8,cVar1.
                                        super__Node_iterator_base<std::pair<const_int,_flow::Value_*(flow::lang::IRGenerator::*)(flow::Value_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_false>
                                        ._M_cur,local_190);
  this->result_ = pVVar7;
  std::__cxx11::string::~string(local_190);
  iVar4 = std::allocator<char>::~allocator(&local_191);
  return iVar4;
}

Assistant:

void IRGenerator::accept(UnaryExpr& expr) {
  static const std::unordered_map<
      int /*Opcode*/,
      Value* (IRGenerator::*)(Value*, const std::string&)> ops =
      {{Opcode::N2S, &IRGenerator::createN2S},
       {Opcode::P2S, &IRGenerator::createP2S},
       {Opcode::C2S, &IRGenerator::createC2S},
       {Opcode::R2S, &IRGenerator::createR2S},
       {Opcode::S2N, &IRGenerator::createS2N},
       {Opcode::NNEG, &IRGenerator::createNeg},
       {Opcode::NNOT, &IRGenerator::createNot},
       {Opcode::BNOT, &IRGenerator::createBNot},
       {Opcode::SLEN, &IRGenerator::createSLen}, };

  Value* rhs = codegen(expr.subExpr());

  auto i = ops.find(expr.op());
  FLOW_ASSERT(i != ops.end(), fmt::format("Unsupported unary expression {} in IRGenerator.", mnemonic(expr.op())));
  result_ = (this->*i->second)(rhs, "");
}